

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++.cc
# Opt level: O2

Status __thiscall
osqp::anon_unknown_6::UpdateUpperTriangularObjectiveMatrix
          (anon_unknown_6 *this,SparseMatrix<double,_0,_long_long> *objective_matrix_upper_triangle,
          OSQPWorkspaceHelper *workspace)

{
  OSQPData *pOVar1;
  Index P_new_n;
  c_int cVar2;
  Status *result;
  string_view message;
  string_view message_00;
  c_int num_variables;
  size_t local_58;
  size_t local_50;
  string local_48;
  FormatSpec<long,_long,_long_long> local_28;
  
  pOVar1 = (workspace->super_OSQPWorkspace).data;
  num_variables = pOVar1->n;
  local_58 = objective_matrix_upper_triangle->m_outerSize;
  local_50 = objective_matrix_upper_triangle->m_innerSize;
  if (num_variables == local_50 && local_50 == local_58) {
    VerifySameSparsity(this,objective_matrix_upper_triangle,pOVar1->P,num_variables);
    if (*(long *)this == 1) {
      absl::Status::~Status((Status *)this);
      P_new_n = Eigen::SparseCompressedBase<Eigen::SparseMatrix<double,_0,_long_long>_>::nonZeros
                          (&objective_matrix_upper_triangle->
                            super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_long_long>_>);
      cVar2 = osqp_update_P(&workspace->super_OSQPWorkspace,
                            (objective_matrix_upper_triangle->m_data).m_values,(c_int *)0x0,P_new_n)
      ;
      if ((int)cVar2 == 0) {
        *(undefined8 *)this = 1;
      }
      else {
        message._M_str = (char *)0x38;
        message._M_len = (size_t)this;
        absl::UnknownError(message);
      }
    }
  }
  else {
    local_28.super_type.spec_.data_ =
         "The new objective matrix should be square with dimension equal to the number of variables. Matrix dimensions: %d x %d, num_variables=%d"
    ;
    local_28.super_type.spec_.size_ = 0x87;
    absl::StrFormat<long,_long,_long_long>
              (&local_48,&local_28,(long *)&local_50,(long *)&local_58,&num_variables);
    message_00._M_str = (char *)local_48._M_string_length;
    message_00._M_len = (size_t)this;
    absl::InvalidArgumentError(message_00);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status UpdateUpperTriangularObjectiveMatrix(
    const Eigen::SparseMatrix<double, Eigen::ColMajor, c_int>&
        objective_matrix_upper_triangle,
    OSQPWorkspaceHelper* workspace) {
  const c_int num_variables = workspace->data->n;

  if (objective_matrix_upper_triangle.rows() !=
          objective_matrix_upper_triangle.cols() ||
      objective_matrix_upper_triangle.rows() != num_variables) {
    return absl::InvalidArgumentError(absl::StrFormat(
        "The new objective matrix should be square with dimension equal to the "
        "number of variables. Matrix dimensions: %d x %d, num_variables=%d",
        objective_matrix_upper_triangle.rows(),
        objective_matrix_upper_triangle.cols(), num_variables));
  }

  OSQP_RETURN_IF_ERROR(VerifySameSparsity(objective_matrix_upper_triangle,
                                          workspace->data->P, num_variables));

  c_int nnzP = objective_matrix_upper_triangle.nonZeros();

  const int return_code = osqp_update_P(
      workspace, objective_matrix_upper_triangle.valuePtr(), OSQP_NULL, nnzP);
  if (return_code == 0) {
    return absl::OkStatus();
  }
  return absl::UnknownError(
      "Unable to update OSQP P matrix: unrecognized error code.");
}